

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_stfs(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t regno;
  TCGv_i64 EA_00;
  TCGv_i64 dst;
  TCGv_i64 t0;
  TCGv_i64 EA;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->fpu_enabled ^ 0xffU) & 1) == 0) {
    gen_set_access_type(ctx,0x30);
    EA_00 = tcg_temp_new_i64(tcg_ctx_00);
    dst = tcg_temp_new_i64(tcg_ctx_00);
    gen_addr_imm_index(ctx,EA_00,0);
    regno = rS(ctx->opcode);
    get_fpr(tcg_ctx_00,dst,regno);
    gen_qemu_st32fs(ctx,dst,EA_00);
    tcg_temp_free_i64(tcg_ctx_00,EA_00);
    tcg_temp_free_i64(tcg_ctx_00,dst);
  }
  else {
    gen_exception(ctx,7);
  }
  return;
}

Assistant:

static void gen_stfdepx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    CHK_SV;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    gen_set_access_type(ctx, ACCESS_FLOAT);
    EA = tcg_temp_new(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    get_fpr(tcg_ctx, t0, rD(ctx->opcode));
    tcg_gen_qemu_st_i64(tcg_ctx, t0, EA, PPC_TLB_EPID_STORE, DEF_MEMOP(MO_Q));
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
}